

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

double __thiscall
wasm::Random::pickGivenNum<double,long,unsigned_int,unsigned_long>
          (Random *this,size_t num,double first,long args,uint args_1,unsigned_long args_2)

{
  undefined1 auVar1 [16];
  
  if (num != 0) {
    if (num == 1) {
      return (double)args;
    }
    if (num == 2) {
      return (double)args_1;
    }
    if (num != 3) {
      __assert_fail("num == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/random.h"
                    ,0x5d,"T wasm::Random::pickGivenNum(size_t, T) [T = double]");
    }
    auVar1._8_4_ = (int)(args_2 >> 0x20);
    auVar1._0_8_ = args_2;
    auVar1._12_4_ = 0x45300000;
    first = (auVar1._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)args_2) - 4503599627370496.0);
  }
  return first;
}

Assistant:

T pickGivenNum(size_t num, T first, Args... args) {
    if (num == 0) {
      return first;
    }
    return pickGivenNum<T>(num - 1, args...);
  }